

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertHelper *this_00;
  value_type vVar3;
  AssertHelper *this_01;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea8;
  AssertionResult *in_stack_fffffffffffffeb0;
  unsigned_long *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffed0;
  Type in_stack_fffffffffffffedc;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_118 [2];
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int iVar4;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar5;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff30;
  AssertionResult local_98 [3];
  size_type local_68;
  AssertionResult local_60;
  size_type local_50;
  value_type local_1c;
  int local_14;
  size_type local_10;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    local_10 = google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9c8bc);
    local_14 = 1;
    while (sVar2 = google::
                   BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xb9c8dd), sVar2 == local_10) {
      in_stack_fffffffffffffec0 = in_RDI + 0x10;
      local_1c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffffea8,0);
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff30,
               (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_14 = local_14 + 1;
    }
    local_50 = google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9c947);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)0xb9c95d);
    local_68 = google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9c96b);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_RDI,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (unsigned_long *)in_stack_fffffffffffffeb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffee0);
      in_stack_fffffffffffffeb8 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xb9c9d2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffec0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff30,
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
      testing::Message::~Message((Message *)0xb9ca2f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9ca9d);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::empty((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)0xb9caab);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffeb0,(bool *)in_stack_fffffffffffffea8,(type *)0xb9cacd);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffee0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffec0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff30,
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      testing::Message::~Message((Message *)0xb9cba0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9cc37);
    for (iVar5 = 1; iVar5 < local_14; iVar5 = iVar5 + 1) {
      this_00 = (AssertHelper *)(in_RDI + 0x10);
      vVar3 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffea8,0);
      iVar4 = vVar3.second;
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff30,(value_type *)CONCAT44(iVar5,iVar4));
      this_01 = (AssertHelper *)
                google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xb9cca1);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_RDI,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(unsigned_long *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        in_stack_fffffffffffffea8 =
             (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xb9cd08);
        testing::internal::AssertHelper::AssertHelper
                  (this_01,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                   (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffec0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff30,(Message *)CONCAT44(iVar5,iVar4));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xb9cd54);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9cdb6);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}